

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::iteratorAccessTest<false>(ViewTest *this)

{
  int *data;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  reference piVar1;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar2;
  reference piVar3;
  reference piVar4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  int i;
  uint uVar6;
  long lVar7;
  iterator local_118;
  iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&it);
    local_118.view_._0_1_ = *piVar1 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_118.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar6 = 0x17; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_118.view_._0_1_ = *piVar3 == data[uVar6];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it,(reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_118.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    local_118.view_._0_1_ = *piVar4 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
  local_118.view_._0_1_ = *piVar4 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 6;
  begin_01._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&it);
    local_118.view_._0_1_ = *piVar1 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_118.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 6;
  begin_02._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar6 = 0x17; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_118.view_._0_1_ = *piVar3 == data[uVar6];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it,(reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_118.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,2,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 6;
  begin_06._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    local_118.view_._0_1_ = *piVar4 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
  local_118.view_._0_1_ = *piVar4 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 3;
  begin_03._M_current[1] = 4;
  begin_03._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&it);
    local_118.view_._0_1_ = *piVar1 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_118.view_._0_1_ = *piVar1 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 3;
  begin_04._M_current[1] = 4;
  begin_04._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)&local_118,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar6 = 0x17; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it);
    local_118.view_._0_1_ = *piVar3 == data[uVar6];
    test((bool *)&local_118);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend((reverse_iterator *)&local_118,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)&it,(reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)&local_118);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  piVar3 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                      *)&it);
  local_118.view_._0_1_ = *piVar3 == 0;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,3,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 3;
  begin_07._M_current[1] = 4;
  begin_07._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a0);
  for (lVar7 = 1; lVar7 != 0x19; lVar7 = lVar7 + 1) {
    piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    local_118.view_._0_1_ = *piVar4 == this->data_[lVar7 + -1];
    test((bool *)&local_118);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end(&local_118,&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_118);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  piVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar5);
  local_118.view_._0_1_ = *piVar4 == 0x17;
  test((bool *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}